

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Token * __thiscall wabt::WastParser::GetToken(Token *__return_storage_ptr__,WastParser *this)

{
  bool bVar1;
  reference other;
  Token local_68;
  WastParser *local_18;
  WastParser *this_local;
  
  local_18 = this;
  this_local = (WastParser *)__return_storage_ptr__;
  bVar1 = CircularArray<wabt::Token,_2UL>::empty(&this->tokens_);
  if (bVar1) {
    WastLexer::GetToken(&local_68,this->lexer_,this);
    CircularArray<wabt::Token,_2UL>::push_back(&this->tokens_,&local_68);
    Token::~Token(&local_68);
  }
  other = CircularArray<wabt::Token,_2UL>::front(&this->tokens_);
  Token::Token(__return_storage_ptr__,other);
  return __return_storage_ptr__;
}

Assistant:

Token WastParser::GetToken() {
  if (tokens_.empty()) {
    tokens_.push_back(lexer_->GetToken(this));
  }
  return tokens_.front();
}